

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_range_expression(Parser *this)

{
  bool bVar1;
  Expression *left;
  Expression *pEVar2;
  Expression *pEVar3;
  Token oper;
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  left = parse_logical_or_expression(this);
  while( true ) {
    while( true ) {
      bVar1 = match(this,TK_INCLUSIVE_RANGE);
      if (!bVar1) break;
      Token::operator=(&oper,(this->matched)._M_current);
      pEVar2 = (Expression *)operator_new(0x68);
      pEVar3 = parse_logical_or_expression(this);
      InclusiveRangeExpression::InclusiveRangeExpression
                ((InclusiveRangeExpression *)pEVar2,&oper,left,pEVar3);
      left = pEVar2;
    }
    bVar1 = match(this,TK_EXCLUSIVE_RANGE);
    if (!bVar1) break;
    Token::operator=(&oper,(this->matched)._M_current);
    pEVar2 = (Expression *)operator_new(0x68);
    pEVar3 = parse_logical_or_expression(this);
    ExclusiveRangeExpression::ExclusiveRangeExpression
              ((ExclusiveRangeExpression *)pEVar2,&oper,left,pEVar3);
    left = pEVar2;
  }
  std::__cxx11::string::~string((string *)&oper.lexem);
  return left;
}

Assistant:

Expression *Parser::parse_range_expression() {
    Token oper;
    Expression* expression = parse_logical_or_expression();

    while (true) {
        if (match(TK_INCLUSIVE_RANGE)) {
            oper = *matched;
            expression = new InclusiveRangeExpression(oper, expression, parse_logical_or_expression());
        } else if (match(TK_EXCLUSIVE_RANGE)) {
            oper = *matched;
            expression = new ExclusiveRangeExpression(oper, expression, parse_logical_or_expression());
        } else {
            break;
        }
    }

    return expression;
}